

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.cc
# Opt level: O3

void brotli::RecomputeDistancePrefixes
               (Command *cmds,size_t num_commands,uint32_t num_direct_distance_codes,
               uint32_t distance_postfix_bits)

{
  ushort uVar1;
  byte bVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  uint16_t *puVar6;
  ulong uVar7;
  uint uVar8;
  uint32_t uVar9;
  ulong uVar10;
  ulong uVar11;
  
  if (num_commands != 0 && (distance_postfix_bits != 0 || num_direct_distance_codes != 0)) {
    uVar7 = (ulong)num_direct_distance_codes + 0x10;
    bVar2 = (byte)distance_postfix_bits;
    puVar6 = &cmds->dist_prefix_;
    do {
      if ((*(uint32_t *)(puVar6 + -9) != 0) && (0x7f < puVar6[-1])) {
        uVar1 = *puVar6;
        uVar3 = (uint)uVar1;
        if (0xf < uVar1) {
          uVar3 = *(uint *)(puVar6 + -3);
          uVar3 = ((uint)uVar1 + (uVar3 >> 0x18) * -2 + -0xc << ((byte)(uVar3 >> 0x18) & 0x1f)) +
                  (uVar3 & 0xffffff) + 0xc;
        }
        uVar5 = (ulong)uVar3;
        uVar9 = 0;
        if (uVar7 <= uVar5) {
          uVar10 = (uVar5 - uVar7) + (long)(1 << (bVar2 + 2 & 0x1f));
          uVar3 = 0x1f;
          uVar8 = (uint)uVar10;
          if (uVar8 != 0) {
            for (; uVar8 >> uVar3 == 0; uVar3 = uVar3 - 1) {
            }
          }
          uVar3 = (uVar3 ^ 0xffffffe0) + 0x1f;
          uVar11 = (ulong)((uVar10 >> ((ulong)uVar3 & 0x3f) & 1) != 0);
          lVar4 = (ulong)uVar3 - (ulong)distance_postfix_bits;
          uVar5 = (uVar8 & ~(-1 << (bVar2 & 0x1f))) + uVar7 +
                  (uVar11 + lVar4 * 2 + 0xfffe << (bVar2 & 0x3f));
          uVar9 = (uint)(uVar10 - (uVar11 + 2 << ((byte)uVar3 & 0x3f)) >> (bVar2 & 0x3f)) |
                  (int)lVar4 << 0x18;
        }
        *puVar6 = (ushort)uVar5;
        *(uint32_t *)(puVar6 + -3) = uVar9;
      }
      puVar6 = puVar6 + 0xc;
      num_commands = num_commands - 1;
    } while (num_commands != 0);
  }
  return;
}

Assistant:

void RecomputeDistancePrefixes(Command* cmds,
                               size_t num_commands,
                               uint32_t num_direct_distance_codes,
                               uint32_t distance_postfix_bits) {
  if (num_direct_distance_codes == 0 && distance_postfix_bits == 0) {
    return;
  }
  for (size_t i = 0; i < num_commands; ++i) {
    Command* cmd = &cmds[i];
    if (cmd->copy_len_ > 0 && cmd->cmd_prefix_ >= 128) {
      PrefixEncodeCopyDistance(cmd->DistanceCode(),
                               num_direct_distance_codes,
                               distance_postfix_bits,
                               &cmd->dist_prefix_,
                               &cmd->dist_extra_);
    }
  }
}